

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_Font * __thiscall
ON_ManagedFonts::GetFromFontCharacteristics
          (ON_ManagedFonts *this,ON_Font *font_characteristics,bool bCreateIfNotFound)

{
  ON_FontList *this_00;
  double dVar1;
  element_type *peVar2;
  int iVar3;
  undefined8 uVar4;
  _Head_base<0UL,_ON_Font_*,_false> _Var5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  ON_Font *pOVar11;
  wchar_t *pwVar12;
  wchar_t *pwVar13;
  int iVar14;
  undefined7 in_register_00000011;
  ON_Font *pOVar15;
  ON_wString *pOVar16;
  int iVar17;
  ON_FontMetrics *managed_font_metrics_in_font_design_units;
  pointer __p_1;
  pointer __p;
  bool bVar18;
  unique_ptr<ON_Font,_std::default_delete<ON_Font>_> fup;
  ON_MemoryAllocationTracking disable_tracking;
  ON_wString local_130;
  bool local_122;
  byte local_121;
  _Head_base<0UL,_ON_Font_*,_false> local_120;
  double local_118;
  undefined8 uStack_110;
  ON_wString local_100;
  uint local_f8;
  undefined4 local_f4;
  ON_Font local_f0;
  
  local_f4 = (undefined4)CONCAT71(in_register_00000011,bCreateIfNotFound);
  if ((this->m_managed_fonts).m_by_index.m_count == 0) {
    Internal_AddManagedFont(this,&ON_Font::Default,(ON_FontMetrics *)0x0);
  }
  if (font_characteristics->m_runtime_serial_number != 0) {
    return font_characteristics;
  }
  bVar8 = font_characteristics->m_font_bUnderlined;
  bVar7 = font_characteristics->m_font_bStrikethrough;
  dVar1 = font_characteristics->m_point_size;
  local_118 = (double)(-(ulong)(dVar1 < 10000000000.0) & (ulong)dVar1 & -(ulong)(0.0 < dVar1));
  uStack_110 = 0;
  local_120._M_head_impl = (ON_Font *)0x0;
  if (font_characteristics->m_font_type != InstalledFont) {
    bVar6 = ON_wString::IsNotEmpty(&font_characteristics->m_loc_postscript_name);
    pOVar15 = (ON_Font *)&font_characteristics->m_en_postscript_name;
    if (bVar6) {
      pOVar15 = (ON_Font *)&font_characteristics->m_loc_postscript_name;
    }
    ON_wString::ON_wString((ON_wString *)&local_f0,(ON_wString *)pOVar15);
    bVar6 = ON_wString::IsNotEmpty((ON_wString *)&local_f0);
    if (bVar6) {
LAB_00473ec8:
      ON_wString::~ON_wString((ON_wString *)&local_f0);
LAB_00473ed2:
      bVar6 = true;
      if (((font_characteristics->m_font_style == Unset) ||
          (font_characteristics->m_font_weight == Unset)) ||
         (font_characteristics->m_font_stretch == Unset)) goto LAB_00473f41;
    }
    else {
      bVar6 = ON_wString::IsNotEmpty(&font_characteristics->m_loc_windows_logfont_name);
      pOVar15 = (ON_Font *)&font_characteristics->m_en_windows_logfont_name;
      if (bVar6) {
        pOVar15 = (ON_Font *)&font_characteristics->m_loc_windows_logfont_name;
      }
      ON_wString::ON_wString(&local_130,(ON_wString *)pOVar15);
      bVar6 = ON_wString::IsNotEmpty(&local_130);
      if (bVar6) {
        ON_wString::~ON_wString(&local_130);
        goto LAB_00473ec8;
      }
      bVar6 = ON_wString::IsNotEmpty(&font_characteristics->m_loc_family_name);
      pOVar15 = (ON_Font *)&font_characteristics->m_en_family_name;
      if (bVar6) {
        pOVar15 = (ON_Font *)&font_characteristics->m_loc_family_name;
      }
      ON_wString::ON_wString(&local_100,(ON_wString *)pOVar15);
      bVar6 = ON_wString::IsNotEmpty(&local_100);
      ON_wString::~ON_wString(&local_100);
      ON_wString::~ON_wString(&local_130);
      ON_wString::~ON_wString((ON_wString *)&local_f0);
      if (bVar6) goto LAB_00473ed2;
      bVar6 = false;
LAB_00473f41:
      pOVar11 = (ON_Font *)operator_new(0xc0);
      pOVar15 = font_characteristics;
      ON_Font::ON_Font(pOVar11,font_characteristics);
      _Var5._M_head_impl = local_120._M_head_impl;
      local_f0.m_runtime_serial_number = 0;
      local_f0.m_windows_logfont_weight = 0;
      bVar18 = local_120._M_head_impl != (ON_Font *)0x0;
      local_120._M_head_impl = pOVar11;
      if (bVar18) {
        ON_Font::~ON_Font(_Var5._M_head_impl);
        pOVar15 = (ON_Font *)0xc0;
        operator_delete(_Var5._M_head_impl,0xc0);
      }
      std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr
                ((unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&local_f0);
      _Var5._M_head_impl = local_120._M_head_impl;
      if (local_120._M_head_impl != (ON_Font *)0x0) {
        if (bVar6) {
          pOVar15 = &ON_Font::Default;
          ON_Font::SetUnsetProperties(local_120._M_head_impl,&ON_Font::Default,false);
        }
        else {
          pOVar15 = &ON_Font::Default;
          ON_Font::operator=(local_120._M_head_impl,&ON_Font::Default);
        }
        if ((_Var5._M_head_impl)->m_font_bUnderlined != bVar8) {
          pOVar15 = (ON_Font *)0x6d8075;
          bVar6 = ON_Font::ModificationPermitted
                            (_Var5._M_head_impl,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                             ,0x2ecb);
          if (bVar6) {
            (_Var5._M_head_impl)->m_font_bUnderlined = bVar8;
            uVar4 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
            *(undefined8 *)((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest =
                 ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
            *(undefined8 *)(((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest + 8) =
                 uVar4;
            *(undefined4 *)(((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest + 0x10) =
                 ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
          }
        }
        if ((_Var5._M_head_impl)->m_font_bStrikethrough != bVar7) {
          pOVar15 = (ON_Font *)0x6d8075;
          bVar6 = ON_Font::ModificationPermitted
                            (_Var5._M_head_impl,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                             ,0x2edc);
          if (bVar6) {
            (_Var5._M_head_impl)->m_font_bStrikethrough = bVar7;
            uVar4 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
            *(undefined8 *)((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest =
                 ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
            *(undefined8 *)(((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest + 8) =
                 uVar4;
            *(undefined4 *)(((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest + 0x10) =
                 ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
          }
        }
        ON_Font::SetPointSize(_Var5._M_head_impl,local_118);
        font_characteristics = _Var5._M_head_impl;
      }
    }
    bVar6 = ON_Font::IsValid(font_characteristics,(ON_TextLog *)pOVar15);
    if (!bVar6) {
      pOVar15 = &ON_Font::Default;
      goto LAB_00474777;
    }
  }
  local_121 = bVar8 | bVar7;
  local_122 = bVar7;
  if (local_121 == 0) {
    pOVar15 = &ON_Font::Default;
    if ((local_118 != 0.0) || (NAN(local_118))) {
      if ((local_118 != ON_Font::Default.m_point_size) ||
         (NAN(local_118) || NAN(ON_Font::Default.m_point_size))) goto LAB_0047438c;
    }
    if (((ON_Font::Default.m_font_weight == font_characteristics->m_font_weight) &&
        (ON_Font::Default.m_font_stretch == font_characteristics->m_font_stretch)) &&
       (ON_Font::Default.m_font_style == font_characteristics->m_font_style)) {
      bVar7 = ON_wString::IsNotEmpty(&font_characteristics->m_loc_postscript_name);
      pOVar16 = &font_characteristics->m_en_postscript_name;
      if (bVar7) {
        pOVar16 = &font_characteristics->m_loc_postscript_name;
      }
      ON_wString::ON_wString((ON_wString *)&local_f0,pOVar16);
      bVar7 = ON_wString::IsNotEmpty((ON_wString *)&local_f0);
      if (bVar7) {
        pwVar12 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_f0);
        bVar7 = ON_wString::IsNotEmpty(&ON_Font::Default.m_loc_postscript_name);
        ON_wString::ON_wString
                  (&local_130,
                   (ON_wString *)
                   (ON_Font::Default.m_font_characteristics_hash.m_digest +
                   (ulong)!bVar7 * 8 + -0x4c));
        pwVar13 = ON_wString::operator_cast_to_wchar_t_(&local_130);
        bVar7 = ON_wString::EqualOrdinal(pwVar12,pwVar13,true);
      }
      else {
        bVar7 = ON_wString::IsNotEmpty(&font_characteristics->m_loc_windows_logfont_name);
        pOVar16 = &font_characteristics->m_en_windows_logfont_name;
        if (bVar7) {
          pOVar16 = &font_characteristics->m_loc_windows_logfont_name;
        }
        ON_wString::ON_wString(&local_130,pOVar16);
        ON_wString::operator=((ON_wString *)&local_f0,&local_130);
        ON_wString::~ON_wString(&local_130);
        bVar7 = ON_wString::IsNotEmpty((ON_wString *)&local_f0);
        if (!bVar7) {
          bVar7 = ON_wString::IsNotEmpty(&font_characteristics->m_loc_family_name);
          pOVar16 = &font_characteristics->m_en_family_name;
          if (bVar7) {
            pOVar16 = &font_characteristics->m_loc_family_name;
          }
          ON_wString::ON_wString(&local_130,pOVar16);
          ON_wString::operator=((ON_wString *)&local_f0,&local_130);
          ON_wString::~ON_wString(&local_130);
          bVar7 = ON_wString::IsNotEmpty((ON_wString *)&local_f0);
          if (bVar7) {
            pwVar12 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_f0);
            bVar7 = ON_wString::IsNotEmpty(&ON_Font::Default.m_loc_family_name);
            ON_wString::ON_wString
                      (&local_130,
                       (ON_wString *)(&ON_Font::Default.m_font_characteristics_hash + -3) + !bVar7);
            pwVar13 = ON_wString::operator_cast_to_wchar_t_(&local_130);
            bVar7 = ON_wString::EqualOrdinal(pwVar12,pwVar13,true);
            ON_wString::~ON_wString(&local_130);
            if (bVar7) {
              bVar7 = ON_wString::IsNotEmpty(&font_characteristics->m_loc_face_name);
              pOVar16 = &font_characteristics->m_en_face_name;
              if (bVar7) {
                pOVar16 = &font_characteristics->m_loc_face_name;
              }
              ON_wString::ON_wString(&local_130,pOVar16);
              ON_wString::operator=((ON_wString *)&local_f0,&local_130);
              ON_wString::~ON_wString(&local_130);
              bVar7 = ON_wString::IsEmpty((ON_wString *)&local_f0);
              if (!bVar7) {
                pwVar12 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_f0);
                bVar7 = ON_wString::IsNotEmpty(&ON_Font::Default.m_loc_face_name);
                ON_wString::ON_wString
                          (&local_130,
                           (ON_wString *)
                           (ON_Font::Default.m_font_characteristics_hash.m_digest +
                           (ulong)!bVar7 * 8 + -0x2c));
                pwVar13 = ON_wString::operator_cast_to_wchar_t_(&local_130);
                bVar7 = ON_wString::EqualOrdinal(pwVar12,pwVar13,true);
                ON_wString::~ON_wString(&local_130);
                if (!bVar7) goto LAB_00474382;
              }
              ON_wString::~ON_wString((ON_wString *)&local_f0);
              goto LAB_00474777;
            }
          }
LAB_00474382:
          ON_wString::~ON_wString((ON_wString *)&local_f0);
          goto LAB_0047438c;
        }
        pwVar12 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&local_f0);
        bVar7 = ON_wString::IsNotEmpty(&ON_Font::Default.m_loc_windows_logfont_name);
        ON_wString::ON_wString
                  (&local_130,
                   (ON_wString *)
                   (ON_Font::Default.m_font_characteristics_hash.m_digest +
                   (ulong)!bVar7 * 8 + -0x1c));
        pwVar13 = ON_wString::operator_cast_to_wchar_t_(&local_130);
        bVar7 = ON_wString::EqualOrdinal(pwVar12,pwVar13,true);
      }
      pOVar15 = &ON_Font::Default;
      ON_wString::~ON_wString(&local_130);
      ON_wString::~ON_wString((ON_wString *)&local_f0);
      if (bVar7 != false) goto LAB_00474777;
    }
  }
LAB_0047438c:
  bVar7 = local_122;
  this_00 = &this->m_managed_fonts;
  uVar10 = (uint)bVar8;
  pOVar15 = ON_FontList::FromFontProperties
                      (this_00,font_characteristics,true,true,bVar8,local_122,local_118);
  if (local_121 == 1 && pOVar15 == (ON_Font *)0x0) {
    ON_Font::ON_Font(&local_f0,font_characteristics);
    if ((local_f0.m_font_bUnderlined != false) &&
       (bVar6 = ON_Font::ModificationPermitted
                          (&local_f0,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                           ,0x2ecb), bVar6)) {
      local_f0.m_font_bUnderlined = false;
      local_f0.m_font_characteristics_hash.m_digest[0] = ON_SHA1_Hash::ZeroDigest.m_digest[0];
      local_f0.m_font_characteristics_hash.m_digest[1] = ON_SHA1_Hash::ZeroDigest.m_digest[1];
      local_f0.m_font_characteristics_hash.m_digest[2] = ON_SHA1_Hash::ZeroDigest.m_digest[2];
      local_f0.m_font_characteristics_hash.m_digest[3] = ON_SHA1_Hash::ZeroDigest.m_digest[3];
      local_f0.m_font_characteristics_hash.m_digest[4] = ON_SHA1_Hash::ZeroDigest.m_digest[4];
      local_f0.m_font_characteristics_hash.m_digest[5] = ON_SHA1_Hash::ZeroDigest.m_digest[5];
      local_f0.m_font_characteristics_hash.m_digest[6] = ON_SHA1_Hash::ZeroDigest.m_digest[6];
      local_f0.m_font_characteristics_hash.m_digest[7] = ON_SHA1_Hash::ZeroDigest.m_digest[7];
      local_f0.m_font_characteristics_hash.m_digest[8] = ON_SHA1_Hash::ZeroDigest.m_digest[8];
      local_f0.m_font_characteristics_hash.m_digest[9] = ON_SHA1_Hash::ZeroDigest.m_digest[9];
      local_f0.m_font_characteristics_hash.m_digest[10] = ON_SHA1_Hash::ZeroDigest.m_digest[10];
      local_f0.m_font_characteristics_hash.m_digest[0xb] = ON_SHA1_Hash::ZeroDigest.m_digest[0xb];
      local_f0.m_font_characteristics_hash.m_digest[0xc] = ON_SHA1_Hash::ZeroDigest.m_digest[0xc];
      local_f0.m_font_characteristics_hash.m_digest[0xd] = ON_SHA1_Hash::ZeroDigest.m_digest[0xd];
      local_f0.m_font_characteristics_hash.m_digest[0xe] = ON_SHA1_Hash::ZeroDigest.m_digest[0xe];
      local_f0.m_font_characteristics_hash.m_digest[0xf] = ON_SHA1_Hash::ZeroDigest.m_digest[0xf];
      local_f0.m_font_characteristics_hash.m_digest[0x10] = ON_SHA1_Hash::ZeroDigest.m_digest[0x10];
      local_f0.m_font_characteristics_hash.m_digest[0x11] = ON_SHA1_Hash::ZeroDigest.m_digest[0x11];
      local_f0.m_font_characteristics_hash.m_digest[0x12] = ON_SHA1_Hash::ZeroDigest.m_digest[0x12];
      local_f0.m_font_characteristics_hash.m_digest[0x13] = ON_SHA1_Hash::ZeroDigest.m_digest[0x13];
    }
    if ((local_f0.m_font_bStrikethrough != false) &&
       (bVar6 = ON_Font::ModificationPermitted
                          (&local_f0,"",
                           "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                           ,0x2edc), bVar6)) {
      local_f0.m_font_bStrikethrough = false;
      local_f0.m_font_characteristics_hash.m_digest[0] = ON_SHA1_Hash::ZeroDigest.m_digest[0];
      local_f0.m_font_characteristics_hash.m_digest[1] = ON_SHA1_Hash::ZeroDigest.m_digest[1];
      local_f0.m_font_characteristics_hash.m_digest[2] = ON_SHA1_Hash::ZeroDigest.m_digest[2];
      local_f0.m_font_characteristics_hash.m_digest[3] = ON_SHA1_Hash::ZeroDigest.m_digest[3];
      local_f0.m_font_characteristics_hash.m_digest[4] = ON_SHA1_Hash::ZeroDigest.m_digest[4];
      local_f0.m_font_characteristics_hash.m_digest[5] = ON_SHA1_Hash::ZeroDigest.m_digest[5];
      local_f0.m_font_characteristics_hash.m_digest[6] = ON_SHA1_Hash::ZeroDigest.m_digest[6];
      local_f0.m_font_characteristics_hash.m_digest[7] = ON_SHA1_Hash::ZeroDigest.m_digest[7];
      local_f0.m_font_characteristics_hash.m_digest[8] = ON_SHA1_Hash::ZeroDigest.m_digest[8];
      local_f0.m_font_characteristics_hash.m_digest[9] = ON_SHA1_Hash::ZeroDigest.m_digest[9];
      local_f0.m_font_characteristics_hash.m_digest[10] = ON_SHA1_Hash::ZeroDigest.m_digest[10];
      local_f0.m_font_characteristics_hash.m_digest[0xb] = ON_SHA1_Hash::ZeroDigest.m_digest[0xb];
      local_f0.m_font_characteristics_hash.m_digest[0xc] = ON_SHA1_Hash::ZeroDigest.m_digest[0xc];
      local_f0.m_font_characteristics_hash.m_digest[0xd] = ON_SHA1_Hash::ZeroDigest.m_digest[0xd];
      local_f0.m_font_characteristics_hash.m_digest[0xe] = ON_SHA1_Hash::ZeroDigest.m_digest[0xe];
      local_f0.m_font_characteristics_hash.m_digest[0xf] = ON_SHA1_Hash::ZeroDigest.m_digest[0xf];
      local_f0.m_font_characteristics_hash.m_digest[0x10] = ON_SHA1_Hash::ZeroDigest.m_digest[0x10];
      local_f0.m_font_characteristics_hash.m_digest[0x11] = ON_SHA1_Hash::ZeroDigest.m_digest[0x11];
      local_f0.m_font_characteristics_hash.m_digest[0x12] = ON_SHA1_Hash::ZeroDigest.m_digest[0x12];
      local_f0.m_font_characteristics_hash.m_digest[0x13] = ON_SHA1_Hash::ZeroDigest.m_digest[0x13];
    }
    pOVar15 = ON_FontList::FromFontProperties(this_00,&local_f0,true,true,false,false,local_118);
    ON_Font::~ON_Font(&local_f0);
  }
  uVar9 = ON_Font::WeightStretchStyleDeviation
                    (font_characteristics->m_font_weight,font_characteristics->m_font_stretch,
                     font_characteristics->m_font_style,pOVar15);
  if (pOVar15 == (ON_Font *)0x0) {
    iVar17 = 0;
    iVar14 = 0;
  }
  else {
    iVar17 = -(uint)pOVar15->m_font_bUnderlined;
    iVar14 = -(uint)pOVar15->m_font_bStrikethrough;
  }
  iVar17 = iVar17 + (uint)font_characteristics->m_font_bUnderlined;
  iVar3 = -iVar17;
  if (0 < iVar17) {
    iVar3 = iVar17;
  }
  iVar14 = iVar14 + (uint)font_characteristics->m_font_bStrikethrough;
  iVar17 = -iVar14;
  if (0 < iVar14) {
    iVar17 = iVar14;
  }
  local_f8 = uVar10;
  if ((pOVar15 != (ON_Font *)0x0) && (iVar17 + iVar3 * 2 == 0 && uVar9 == 0)) {
    if ((local_118 == pOVar15->m_point_size) && (!NAN(local_118) && !NAN(pOVar15->m_point_size)))
    goto LAB_00474777;
  }
  if ((font_characteristics->m_font_type != InstalledFont) &&
     ((((font_characteristics->m_font_type != ManagedFont ||
        (font_characteristics->m_runtime_serial_number == 0)) ||
       (((uint)font_characteristics->m_managed_installed_font_and_bits & 3) != 1)) &&
      (pOVar15 = ON_FontList::FromFontProperties
                           (&this->m_installed_fonts,font_characteristics,true,true),
      pOVar15 != (ON_Font *)0x0)))) {
    font_characteristics = pOVar15;
    if ((0.0 < local_118 | local_121) == 1) {
      pOVar11 = (ON_Font *)operator_new(0xc0);
      ON_Font::ON_Font(pOVar11,pOVar15);
      _Var5._M_head_impl = local_120._M_head_impl;
      local_f0.m_runtime_serial_number = 0;
      local_f0.m_windows_logfont_weight = 0;
      bVar6 = local_120._M_head_impl != (ON_Font *)0x0;
      local_120._M_head_impl = pOVar11;
      if (bVar6) {
        ON_Font::~ON_Font(_Var5._M_head_impl);
        operator_delete(_Var5._M_head_impl,0xc0);
      }
      std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr
                ((unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&local_f0);
      _Var5._M_head_impl = local_120._M_head_impl;
      if (local_120._M_head_impl != (ON_Font *)0x0) {
        if (((local_120._M_head_impl)->m_font_bUnderlined != bVar8) &&
           (bVar6 = ON_Font::ModificationPermitted
                              (local_120._M_head_impl,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                               ,0x2ecb), bVar6)) {
          (_Var5._M_head_impl)->m_font_bUnderlined = bVar8;
          uVar4 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
          *(undefined8 *)((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest =
               ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
          *(undefined8 *)(((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest + 8) = uVar4;
          *(undefined4 *)(((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest + 0x10) =
               ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
        }
        if (((_Var5._M_head_impl)->m_font_bStrikethrough != local_122) &&
           (bVar8 = ON_Font::ModificationPermitted
                              (_Var5._M_head_impl,"",
                               "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                               ,0x2edc), bVar8)) {
          (_Var5._M_head_impl)->m_font_bStrikethrough = local_122;
          uVar4 = ON_SHA1_Hash::ZeroDigest.m_digest._8_8_;
          *(undefined8 *)((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest =
               ON_SHA1_Hash::ZeroDigest.m_digest._0_8_;
          *(undefined8 *)(((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest + 8) = uVar4;
          *(undefined4 *)(((_Var5._M_head_impl)->m_font_characteristics_hash).m_digest + 0x10) =
               ON_SHA1_Hash::ZeroDigest.m_digest._16_4_;
        }
        ON_Font::SetPointSize(_Var5._M_head_impl,local_118);
        font_characteristics = _Var5._M_head_impl;
      }
    }
    pOVar15 = ON_FontList::FromFontProperties
                        (this_00,font_characteristics,true,true,SUB41(local_f8,0),bVar7,local_118);
    uVar10 = ON_Font::WeightStretchStyleDeviation
                       (font_characteristics->m_font_weight,font_characteristics->m_font_stretch,
                        font_characteristics->m_font_style,pOVar15);
    if (pOVar15 == (ON_Font *)0x0) {
      iVar17 = 0;
      iVar14 = 0;
    }
    else {
      iVar17 = -(uint)pOVar15->m_font_bUnderlined;
      iVar14 = -(uint)pOVar15->m_font_bStrikethrough;
    }
    iVar17 = iVar17 + (uint)font_characteristics->m_font_bUnderlined;
    iVar3 = -iVar17;
    if (0 < iVar17) {
      iVar3 = iVar17;
    }
    iVar14 = iVar14 + (uint)font_characteristics->m_font_bStrikethrough;
    iVar17 = -iVar14;
    if (0 < iVar14) {
      iVar17 = iVar14;
    }
    if ((pOVar15 != (ON_Font *)0x0) && (iVar17 + iVar3 * 2 == 0 && uVar10 == 0)) goto LAB_00474777;
  }
  if ((char)local_f4 == '\0') {
    pOVar15 = (ON_Font *)0x0;
  }
  else {
    ON_MemoryAllocationTracking::ON_MemoryAllocationTracking
              ((ON_MemoryAllocationTracking *)&local_f0,false);
    peVar2 = (font_characteristics->m_font_glyph_cache).
             super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    managed_font_metrics_in_font_design_units = &peVar2->m_font_unit_metrics;
    if (peVar2 == (element_type *)0x0) {
      managed_font_metrics_in_font_design_units = (ON_FontMetrics *)0x0;
    }
    pOVar15 = (ON_Font *)operator_new(0xc0);
    ON_Font::ON_Font(pOVar15,ManagedFont,font_characteristics);
    Internal_AddManagedFont(this,pOVar15,managed_font_metrics_in_font_design_units);
    ON_MemoryAllocationTracking::~ON_MemoryAllocationTracking
              ((ON_MemoryAllocationTracking *)&local_f0);
  }
LAB_00474777:
  std::unique_ptr<ON_Font,_std::default_delete<ON_Font>_>::~unique_ptr
            ((unique_ptr<ON_Font,_std::default_delete<ON_Font>_> *)&local_120);
  return pOVar15;
}

Assistant:

const ON_Font* ON_ManagedFonts::GetFromFontCharacteristics(
  const ON_Font& font_characteristics,
  bool bCreateIfNotFound
)
{
  if ( 0 == m_managed_fonts.Count() )
  {
    // Put ON_Font::Default as the first entry in this list.
    Internal_AddManagedFont( &ON_Font::Default, nullptr );
  }

  if (font_characteristics.IsManagedFont())
    return &font_characteristics;


  const bool bIsUnderlined = font_characteristics.IsUnderlined();
  const bool bIsStrikethrough = font_characteristics.IsStrikethrough();
  const double point_size
    = ON_Font::IsValidPointSize(font_characteristics.PointSize())
    ? font_characteristics.PointSize()
    : 0.0;

  const ON_Font* set_font_characteristics = &font_characteristics;

  std::unique_ptr< ON_Font > fup;
  if (false == font_characteristics.IsInstalledFont())
  {
    bool bHaveName
      = font_characteristics.PostScriptName().IsNotEmpty()
      || font_characteristics.WindowsLogfontName().IsNotEmpty()
      || font_characteristics.FamilyName().IsNotEmpty();
    if ( false == bHaveName || font_characteristics.HasUnsetProperties(false, false) )
    {
      fup = std::make_unique< ON_Font >(font_characteristics);
      ON_Font* temporary_font = fup.get();
      if (nullptr != temporary_font)
      {
        if (false == bHaveName)
        {
          *temporary_font = ON_Font::Default;
        }
        else
        {
          temporary_font->SetUnsetProperties(ON_Font::Default, true);
        }
        temporary_font->SetUnderlined(bIsUnderlined);
        temporary_font->SetStrikethrough(bIsStrikethrough);
        temporary_font->SetPointSize(point_size);
        set_font_characteristics = temporary_font;
      }
    }

    if (false == set_font_characteristics->IsValid())
      return &ON_Font::Default;
  }

  ON_Font::NameLocale name_locale = ON_Font::NameLocale::LocalizedFirst;

  for (;;)
  {
    // quick test for default font that occurs often enough to warrant the special checking
    if (bIsUnderlined)
      break;
    if (bIsStrikethrough)
      break;
    if (0.0 != point_size && point_size != ON_Font::Default.m_point_size)
      break;

    if (false == ON_Font::EqualWeightStretchStyle(&ON_Font::Default, set_font_characteristics, false))
      break; // there are multiple weight-stretch-style settings for the same family name and same LOGFONT.lfFaceName.

    ON_wString name = set_font_characteristics->PostScriptName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.PostScriptName(name_locale), true))
      {
        return &ON_Font::Default;
      }
      break; // Different PostScript names
    }

    name = set_font_characteristics->WindowsLogfontName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.WindowsLogfontName(name_locale), true))
      {
        return &ON_Font::Default;
      }
      break; // Different LOGFONT settings
    }

    name = set_font_characteristics->FamilyName(name_locale);
    if (name.IsNotEmpty())
    {
      if (ON_wString::EqualOrdinal(name, ON_Font::Default.FamilyName(name_locale), true))
      {
        name = set_font_characteristics->FaceName(name_locale);
        if (
          name.IsEmpty()
          || ON_wString::EqualOrdinal(name, ON_Font::Default.FaceName(name_locale), true)
          )
        {
          return &ON_Font::Default;
        }
      }
      break; // Different faces
    }

    break;
  }

  const ON_Font* managed_font = m_managed_fonts.FromFontProperties(
    set_font_characteristics,
    true,
    true,
    bIsUnderlined,
    bIsStrikethrough,
    point_size
    );

  if (nullptr == managed_font && (bIsUnderlined || bIsStrikethrough))
  {
    ON_Font undecorated(*set_font_characteristics);
    undecorated.SetUnderlined(false);
    undecorated.SetStrikethrough(false);
    managed_font = m_managed_fonts.FromFontProperties(
      &undecorated,
      true,
      true,
      false, // ignore bIsUnderlined
      false, // ignore bIsStrikethrough
      point_size
    );
  }

  unsigned int managed_font_wss_dev = ON_Font::WeightStretchStyleDeviation(
    set_font_characteristics, 
    managed_font
  );

  // Lowell - Added additional check for matching underline and strikethrough settings RH-60947
  unsigned int managed_font_us_dev = ON_Font::UnderlinedStrikethroughDeviation(
    set_font_characteristics, 
    managed_font
  );

  if (
    nullptr != managed_font 
    && 0 == managed_font_wss_dev
    && 0 == managed_font_us_dev
    && point_size == managed_font->PointSize()
    )
  {
    return managed_font;
  }


  for(;;)
  {
    if (set_font_characteristics->IsInstalledFont())
      break;

    const ON_Font* installed_font
      = m_installed_fonts.FromFontProperties(
        set_font_characteristics,
        true,
        true
      );
    if (nullptr == installed_font)
      break;

    set_font_characteristics = installed_font;
    if (bIsUnderlined || bIsStrikethrough || point_size > 0.0)
    {
      // Need a copy to set underlined/strikethrough/point_size
      fup = std::make_unique< ON_Font >(*installed_font);
      ON_Font* temporary_font = fup.get();
      if (nullptr != temporary_font)
      {
        temporary_font->SetUnderlined(bIsUnderlined);
        temporary_font->SetStrikethrough(bIsStrikethrough);
        temporary_font->SetPointSize(point_size);
        set_font_characteristics = temporary_font;
      }
    }

    // Look again now that we have settings known to be correct.
    managed_font = m_managed_fonts.FromFontProperties(
      set_font_characteristics,
      true,
      true,
      bIsUnderlined,
      bIsStrikethrough,
      point_size
      );

    managed_font_wss_dev = ON_Font::WeightStretchStyleDeviation(
      set_font_characteristics->FontWeight(), 
      set_font_characteristics->FontStretch(), 
      set_font_characteristics->FontStyle(), 
      managed_font
    );

    // RH - 60947
    managed_font_us_dev = ON_Font::UnderlinedStrikethroughDeviation(
      set_font_characteristics->IsUnderlined(),
      set_font_characteristics->IsStrikethrough(),
      managed_font
    );


    if (nullptr != managed_font 
      && 0 == managed_font_wss_dev
      && 0 == managed_font_us_dev
      )
      return managed_font;

    break;
  }

  if (false == bCreateIfNotFound)
    return nullptr;

  // The managed font constructor does not copy user data, m_font_index, m_font_id, m_gonna_change_font_cache
  ON_MemoryAllocationTracking disable_tracking(false);
  const ON_FontMetrics* font_metrics = nullptr;
  const ON_FontGlyphCache* font_glyph_cache = set_font_characteristics->m_font_glyph_cache.get();
  if (nullptr != font_glyph_cache)
    font_metrics = &font_glyph_cache->m_font_unit_metrics;
  managed_font = Internal_AddManagedFont(
    new ON_Font( ON_Font::FontType::ManagedFont, *set_font_characteristics),
    font_metrics
  );

  return managed_font;
}